

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

MapFlushCallStatistics *
deqp::gles3::Performance::anon_unknown_1::calculateSampleStatistics
          (MapFlushCallStatistics *__return_storage_ptr__,LineParametersWithConfidence *fit,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
          *samples)

{
  pointer pUVar1;
  ulong uVar2;
  ulong uVar3;
  deUint64 *pdVar4;
  int *piVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  allocator_type local_59;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,((long)(samples->
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(samples->
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x48,
             (allocator_type *)&processingRates);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x48;
  uVar6 = 0;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = uVar6;
  }
  pdVar4 = &(pUVar1->duration).fitResponseDuration;
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = *pdVar4;
    pdVar4 = pdVar4 + 9;
  }
  std::vector<float,_std::allocator<float>_>::vector(&processingRates,uVar2,&local_59);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x48;
  uVar6 = 0;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = uVar6;
  }
  piVar5 = &pUVar1->writtenSize;
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] =
         (float)*piVar5 /
         (((float)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6] / 1000.0) / 1000.0);
    piVar5 = piVar5 + 0x12;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish);
  fVar7 = linearSample<float>((vector<float,_std::allocator<float>_> *)
                              &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5
                             );
  __return_storage_ptr__->medianRate = fVar7;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x48,&local_59);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x48;
  uVar6 = 0;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = uVar6;
  }
  piVar5 = &pUVar1->writtenSize;
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] =
         (float)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6] -
         ((float)*piVar5 * fit->coefficient + fit->offset);
    piVar5 = piVar5 + 0x12;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish);
  __return_storage_ptr__->maxDiffTime =
       processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish[-1];
  fVar7 = linearSample<float>((vector<float,_std::allocator<float>_> *)
                              &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9
                             );
  __return_storage_ptr__->maxDiff9DecileTime = fVar7;
  fVar7 = linearSample<float>((vector<float,_std::allocator<float>_> *)
                              &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5
                             );
  __return_storage_ptr__->medianDiffTime = fVar7;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x48,&local_59);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x48;
  uVar6 = 0;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = uVar6;
  }
  piVar5 = &pUVar1->writtenSize;
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    fVar7 = (float)*piVar5 * fit->coefficient + fit->offset;
    fVar8 = 0.0;
    if (1.0 <= fVar7) {
      fVar8 = ((float)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar6] - fVar7) / fVar7;
    }
    processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = fVar8;
    piVar5 = piVar5 + 0x12;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish);
  __return_storage_ptr__->maxRelDiffTime =
       processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish[-1];
  fVar7 = linearSample<float>((vector<float,_std::allocator<float>_> *)
                              &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9
                             );
  __return_storage_ptr__->max9DecileRelDiffTime = fVar7;
  fVar7 = linearSample<float>((vector<float,_std::allocator<float>_> *)
                              &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5
                             );
  __return_storage_ptr__->medianRelDiffTime = fVar7;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  uVar3 = *values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)uVar3 < 0) {
    piVar5 = (int *)(uVar3 >> 1);
  }
  (__return_storage_ptr__->result).minTime = (float)uVar3;
  uVar3 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if ((long)uVar3 < 0) {
    piVar5 = (int *)(uVar3 >> 1);
  }
  (__return_storage_ptr__->result).maxTime = (float)uVar3;
  fVar7 = linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.5);
  (__return_storage_ptr__->result).medianTime = fVar7;
  fVar7 = linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.1);
  (__return_storage_ptr__->result).min2DecileTime = fVar7;
  fVar7 = linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.9);
  (__return_storage_ptr__->result).max9DecileTime = fVar7;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            (&__return_storage_ptr__->map,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)0x0,(offset_in_SampleType_to_deUint64)piVar5);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            (&__return_storage_ptr__->unmap,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)0x8,(offset_in_SampleType_to_deUint64)piVar5);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            (&__return_storage_ptr__->write,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)0x10,(offset_in_SampleType_to_deUint64)piVar5);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            (&__return_storage_ptr__->flush,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)0x18,(offset_in_SampleType_to_deUint64)piVar5);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            (&__return_storage_ptr__->alloc,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)0x20,(offset_in_SampleType_to_deUint64)piVar5);
  return __return_storage_ptr__;
}

Assistant:

static MapFlushCallStatistics calculateSampleStatistics (const LineParametersWithConfidence& fit, const std::vector<UploadSampleResult<MapBufferRangeFlushDuration> >& samples)
{
	MapFlushCallStatistics stats;

	calculateBasicTransferStatistics(stats, fit, samples);

	stats.map	= calculateSingleOperationStatistics(samples, &MapBufferRangeFlushDuration::mapDuration);
	stats.unmap	= calculateSingleOperationStatistics(samples, &MapBufferRangeFlushDuration::unmapDuration);
	stats.write	= calculateSingleOperationStatistics(samples, &MapBufferRangeFlushDuration::writeDuration);
	stats.flush	= calculateSingleOperationStatistics(samples, &MapBufferRangeFlushDuration::flushDuration);
	stats.alloc	= calculateSingleOperationStatistics(samples, &MapBufferRangeFlushDuration::allocDuration);

	return stats;
}